

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ParameterPortListSyntax::setChild
          (ParameterPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0041d498 + *(int *)(&DAT_0041d498 + index * 4)))
            (&child,index,in_RDX,&DAT_0041d498 + *(int *)(&DAT_0041d498 + index * 4));
  return;
}

Assistant:

void ParameterPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: hash = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: declarations = child.node()->as<SeparatedSyntaxList<ParameterDeclarationBaseSyntax>>(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}